

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  size_t sVar1;
  ZSTD_CCtx_params *in_RDI;
  ZSTD_paramSwitch_e useRowMatchFinder;
  size_t outBuffSize;
  size_t inBuffSize;
  size_t blockSize;
  ldmParams_t *in_stack_00000078;
  ZSTD_compressionParameters cParams;
  size_t in_stack_000000a0;
  ZSTD_compressionParameters *in_stack_ffffffffffffff58;
  ZSTD_paramSwitch_e in_stack_ffffffffffffff60;
  size_t local_58;
  byte local_2c;
  ZSTD_cParamMode_e in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  U64 in_stack_ffffffffffffffe8;
  size_t local_8;
  
  if (in_RDI->nbWorkers < 1) {
    ZSTD_getCParamsFromCCtxParams
              (in_RDI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc)
    ;
    sVar1 = ZSTD_resolveMaxBlockSize(in_RDI->maxBlockSize);
    if (sVar1 < (ulong)(1L << (local_2c & 0x3f))) {
      local_58 = ZSTD_resolveMaxBlockSize(in_RDI->maxBlockSize);
    }
    else {
      local_58 = 1L << (local_2c & 0x3f);
    }
    if (in_RDI->outBufferMode == ZSTD_bm_buffered) {
      ZSTD_compressBound(local_58);
    }
    ZSTD_resolveRowMatchFinderMode(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ZSTD_hasExtSeqProd(in_RDI);
    local_8 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                        ((ZSTD_compressionParameters *)cParams._4_8_,in_stack_00000078,
                         blockSize._4_4_,(ZSTD_paramSwitch_e)blockSize,inBuffSize,outBuffSize,
                         cParams._20_8_,(int)params,in_stack_000000a0);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(params->maxBlockSize), (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = (params->inBufferMode == ZSTD_bm_buffered)
                ? ((size_t)1 << cParams.windowLog) + blockSize
                : 0;
        size_t const outBuffSize = (params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder, &params->cParams);

        return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
            &cParams, &params->ldmParams, 1, useRowMatchFinder, inBuffSize, outBuffSize,
            ZSTD_CONTENTSIZE_UNKNOWN, ZSTD_hasExtSeqProd(params), params->maxBlockSize);
    }
}